

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc_data.cpp
# Opt level: O0

void __thiscall NPC_Data::~NPC_Data(NPC_Data *this)

{
  NPC_Data *this_local;
  
  std::unique_ptr<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>::~unique_ptr
            (&this->citizenship);
  std::
  vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  ::~vector(&this->skill_learn);
  std::
  vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
  ::~vector(&this->shop_craft);
  std::
  vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
  ::~vector(&this->shop_trade);
  std::__cxx11::string::~string((string *)&this->skill_name);
  std::__cxx11::string::~string((string *)&this->shop_name);
  std::
  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  ::~vector(&this->drops);
  return;
}

Assistant:

NPC_Data::~NPC_Data()
{

}